

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_array_literal(JSParseState *s)

{
  int iVar1;
  JSParseState *in_RDI;
  bool bVar2;
  bool bVar3;
  BOOL need_length;
  uint32_t idx;
  JSParseState *in_stack_00000038;
  JSParseState *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 uVar4;
  undefined1 uVar5;
  uint v;
  uint8_t uVar6;
  
  iVar1 = next_token(in_stack_00000038);
  if (iVar1 != 0) {
    return -1;
  }
  v = 0;
LAB_00199e6d:
  bVar2 = (in_RDI->token).val != 0x5d;
  uVar5 = bVar2 && v < 0x20;
  if (((bVar2 && v < 0x20) && ((in_RDI->token).val != 0x2c)) && ((in_RDI->token).val != -0x5b)) {
    iVar1 = js_parse_assign_expr((JSParseState *)0x199eb6);
    if (iVar1 != 0) {
      return -1;
    }
    v = v + 1;
    if ((in_RDI->token).val == 0x2c) {
      iVar1 = next_token(in_stack_00000038);
      if (iVar1 != 0) {
        return -1;
      }
      goto LAB_00199e6d;
    }
    if ((in_RDI->token).val != 0x5d) goto LAB_0019a1bc;
    goto LAB_00199e6d;
  }
  emit_op(in_RDI,(uint8_t)(v >> 0x18));
  emit_u16((JSParseState *)
           CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)),
           (uint16_t)((ulong)in_stack_ffffffffffffffd8 >> 0x30));
  bVar2 = false;
  while ((bVar3 = (in_RDI->token).val != 0x5d, uVar4 = bVar3 && v < 0x7fffffff,
         bVar3 && v < 0x7fffffff && ((in_RDI->token).val != -0x5b))) {
    bVar2 = true;
    if ((in_RDI->token).val != 0x2c) {
      iVar1 = js_parse_assign_expr((JSParseState *)0x199f95);
      if (iVar1 != 0) {
        return -1;
      }
      in_stack_ffffffffffffffd8 = in_RDI;
      emit_op(in_RDI,(uint8_t)(v >> 0x18));
      in_RDI = in_stack_ffffffffffffffd8;
      __JS_AtomFromUInt32(v);
      emit_u32((JSParseState *)CONCAT17(uVar5,CONCAT16(uVar4,in_stack_ffffffffffffffe0)),
               (uint32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
      bVar2 = false;
    }
    v = v + 1;
    if (((in_RDI->token).val == 0x2c) && (iVar1 = next_token(in_stack_00000038), iVar1 != 0)) {
      return -1;
    }
  }
  uVar6 = (uint8_t)(v >> 0x18);
  if ((in_RDI->token).val == 0x5d) {
    if (bVar2) {
      emit_op(in_RDI,uVar6);
      uVar6 = (uint8_t)(v >> 0x18);
      emit_op(in_RDI,uVar6);
      emit_u32((JSParseState *)CONCAT17(uVar5,CONCAT16(uVar4,in_stack_ffffffffffffffe0)),
               (uint32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
      emit_op(in_RDI,uVar6);
      emit_atom((JSParseState *)CONCAT17(uVar5,CONCAT16(uVar4,in_stack_ffffffffffffffe0)),
                (JSAtom)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    }
  }
  else {
    emit_op(in_RDI,uVar6);
    emit_u32((JSParseState *)CONCAT17(uVar5,CONCAT16(uVar4,in_stack_ffffffffffffffe0)),
             (uint32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    while (uVar6 = (uint8_t)(v >> 0x18), (in_RDI->token).val != 0x5d) {
      if ((in_RDI->token).val == -0x5b) {
        iVar1 = next_token(in_stack_00000038);
        if (iVar1 != 0) {
          return -1;
        }
        iVar1 = js_parse_assign_expr((JSParseState *)0x19a0d2);
        if (iVar1 != 0) {
          return -1;
        }
        emit_op(in_RDI,(uint8_t)(v >> 0x18));
      }
      else {
        bVar2 = true;
        if ((in_RDI->token).val != 0x2c) {
          iVar1 = js_parse_assign_expr((JSParseState *)0x19a112);
          if (iVar1 != 0) {
            return -1;
          }
          emit_op(in_RDI,(uint8_t)(v >> 0x18));
          bVar2 = false;
        }
        emit_op(in_RDI,(uint8_t)(v >> 0x18));
      }
      uVar6 = (uint8_t)(v >> 0x18);
      if ((in_RDI->token).val != 0x2c) break;
      iVar1 = next_token(in_stack_00000038);
      if (iVar1 != 0) {
        return -1;
      }
    }
    if (bVar2) {
      emit_op(in_RDI,uVar6);
      emit_op(in_RDI,uVar6);
      emit_atom((JSParseState *)CONCAT17(uVar5,CONCAT16(uVar4,in_stack_ffffffffffffffe0)),
                (JSAtom)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    }
    else {
      emit_op(in_RDI,uVar6);
    }
  }
LAB_0019a1bc:
  iVar1 = js_parse_expect(in_stack_ffffffffffffffd8,0);
  return iVar1;
}

Assistant:

static __exception int js_parse_array_literal(JSParseState *s)
{
    uint32_t idx;
    BOOL need_length;

    if (next_token(s))
        return -1;
    /* small regular arrays are created on the stack */
    idx = 0;
    while (s->token.val != ']' && idx < 32) {
        if (s->token.val == ',' || s->token.val == TOK_ELLIPSIS)
            break;
        if (js_parse_assign_expr(s))
            return -1;
        idx++;
        /* accept trailing comma */
        if (s->token.val == ',') {
            if (next_token(s))
                return -1;
        } else
        if (s->token.val != ']')
            goto done;
    }
    emit_op(s, OP_array_from);
    emit_u16(s, idx);

    /* larger arrays and holes are handled with explicit indices */
    need_length = FALSE;
    while (s->token.val != ']' && idx < 0x7fffffff) {
        if (s->token.val == TOK_ELLIPSIS)
            break;
        need_length = TRUE;
        if (s->token.val != ',') {
            if (js_parse_assign_expr(s))
                return -1;
            emit_op(s, OP_define_field);
            emit_u32(s, __JS_AtomFromUInt32(idx));
            need_length = FALSE;
        }
        idx++;
        /* accept trailing comma */
        if (s->token.val == ',') {
            if (next_token(s))
                return -1;
        }
    }
    if (s->token.val == ']') {
        if (need_length) {
            /* Set the length: Cannot use OP_define_field because
               length is not configurable */
            emit_op(s, OP_dup);
            emit_op(s, OP_push_i32);
            emit_u32(s, idx);
            emit_op(s, OP_put_field);
            emit_atom(s, JS_ATOM_length);
        }
        goto done;
    }

    /* huge arrays and spread elements require a dynamic index on the stack */
    emit_op(s, OP_push_i32);
    emit_u32(s, idx);

    /* stack has array, index */
    while (s->token.val != ']') {
        if (s->token.val == TOK_ELLIPSIS) {
            if (next_token(s))
                return -1;
            if (js_parse_assign_expr(s))
                return -1;
#if 1
            emit_op(s, OP_append);
#else
            int label_next, label_done;
            label_next = new_label(s);
            label_done = new_label(s);
            /* enumerate object */
            emit_op(s, OP_for_of_start);
            emit_op(s, OP_rot5l);
            emit_op(s, OP_rot5l);
            emit_label(s, label_next);
            /* on stack: enum_rec array idx */
            emit_op(s, OP_for_of_next);
            emit_u8(s, 2);
            emit_goto(s, OP_if_true, label_done);
            /* append element */
            /* enum_rec array idx val -> enum_rec array new_idx */
            emit_op(s, OP_define_array_el);
            emit_op(s, OP_inc);
            emit_goto(s, OP_goto, label_next);
            emit_label(s, label_done);
            /* close enumeration */
            emit_op(s, OP_drop); /* drop undef val */
            emit_op(s, OP_nip1); /* drop enum_rec */
            emit_op(s, OP_nip1);
            emit_op(s, OP_nip1);
#endif
        } else {
            need_length = TRUE;
            if (s->token.val != ',') {
                if (js_parse_assign_expr(s))
                    return -1;
                /* a idx val */
                emit_op(s, OP_define_array_el);
                need_length = FALSE;
            }
            emit_op(s, OP_inc);
        }
        if (s->token.val != ',')
            break;
        if (next_token(s))
            return -1;
    }
    if (need_length) {
        /* Set the length: cannot use OP_define_field because
           length is not configurable */
        emit_op(s, OP_dup1);    /* array length - array array length */
        emit_op(s, OP_put_field);
        emit_atom(s, JS_ATOM_length);
    } else {
        emit_op(s, OP_drop);    /* array length - array */
    }
done:
    return js_parse_expect(s, ']');
}